

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenInitializer.cxx
# Opt level: O0

void __thiscall
cmQtAutoGenInitializer::RegisterGeneratedSource(cmQtAutoGenInitializer *this,string *filename)

{
  cmSourceFile *pcVar1;
  allocator<char> local_81;
  string local_80;
  allocator<char> local_49;
  string local_48;
  cmSourceFile *local_28;
  cmSourceFile *gFile;
  cmMakefile *makefile;
  string *filename_local;
  cmQtAutoGenInitializer *this_local;
  
  makefile = (cmMakefile *)filename;
  filename_local = (string *)this;
  gFile = (cmSourceFile *)cmTarget::GetMakefile(this->Target->Target);
  pcVar1 = cmMakefile::GetOrCreateSource((cmMakefile *)gFile,(string *)makefile,true,Ambiguous);
  local_28 = pcVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"GENERATED",&local_49);
  cmSourceFile::SetProperty(pcVar1,&local_48,"1");
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  pcVar1 = local_28;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"SKIP_AUTOGEN",&local_81);
  cmSourceFile::SetProperty(pcVar1,&local_80,"1");
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator(&local_81);
  return;
}

Assistant:

void cmQtAutoGenInitializer::RegisterGeneratedSource(
  std::string const& filename)
{
  cmMakefile* makefile = this->Target->Target->GetMakefile();
  cmSourceFile* gFile = makefile->GetOrCreateSource(filename, true);
  gFile->SetProperty("GENERATED", "1");
  gFile->SetProperty("SKIP_AUTOGEN", "1");
}